

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_xfer_send(Curl_easy *data,void *buf,size_t blen,_Bool eos,size_t *pnwritten)

{
  bool local_39;
  CURLcode local_34;
  int sockindex;
  CURLcode result;
  size_t *pnwritten_local;
  _Bool eos_local;
  size_t blen_local;
  void *buf_local;
  Curl_easy *data_local;
  
  local_39 = false;
  if (data->conn->writesockfd != -1) {
    local_39 = data->conn->writesockfd == data->conn->sock[1];
  }
  local_34 = Curl_conn_send(data,(uint)local_39,buf,blen,eos,pnwritten);
  if (local_34 == CURLE_AGAIN) {
    local_34 = CURLE_OK;
    *pnwritten = 0;
  }
  else if ((local_34 == CURLE_OK) && (*pnwritten != 0)) {
    (data->info).request_size = *pnwritten + (data->info).request_size;
  }
  return local_34;
}

Assistant:

CURLcode Curl_xfer_send(struct Curl_easy *data,
                        const void *buf, size_t blen, bool eos,
                        size_t *pnwritten)
{
  CURLcode result;
  int sockindex;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  sockindex = ((data->conn->writesockfd != CURL_SOCKET_BAD) &&
               (data->conn->writesockfd == data->conn->sock[SECONDARYSOCKET]));
  result = Curl_conn_send(data, sockindex, buf, blen, eos, pnwritten);
  if(result == CURLE_AGAIN) {
    result = CURLE_OK;
    *pnwritten = 0;
  }
  else if(!result && *pnwritten)
    data->info.request_size += *pnwritten;

  DEBUGF(infof(data, "Curl_xfer_send(len=%zu, eos=%d) -> %d, %zu",
               blen, eos, result, *pnwritten));
  return result;
}